

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O0

int s98c_register_device(s98c *ctx,char *dev_name,uint32_t clock,uint8_t panpot)

{
  uint uVar1;
  uint32_t uVar2;
  s98deviceinfo *psVar3;
  s98deviceinfo info;
  uint8_t panpot_local;
  uint32_t clock_local;
  char *dev_name_local;
  s98c *ctx_local;
  
  if ((ctx->header).version == -1) {
    fprintf(_stderr,"error: Cannot define #device without #version\n");
    ctx_local._4_4_ = 1;
  }
  else {
    uVar2 = s98c_find_device(dev_name);
    if (uVar2 == 0xffffffff) {
      fprintf(_stderr,"error: Undefined device name: %s\n",dev_name);
      ctx_local._4_4_ = 2;
    }
    else {
      if (ctx->dev_count <= (ulong)(ctx->header).device_count) {
        ctx->dev_count = ctx->dev_count + 4;
        psVar3 = (s98deviceinfo *)realloc(ctx->devices,ctx->dev_count << 4);
        ctx->devices = psVar3;
      }
      psVar3 = ctx->devices;
      uVar1 = (ctx->header).device_count;
      (ctx->header).device_count = uVar1 + 1;
      psVar3 = psVar3 + uVar1;
      psVar3->device = uVar2;
      psVar3->clock = clock;
      psVar3->panpot = (int)(ulong)panpot;
      psVar3->reserved = (int)((ulong)panpot >> 0x20);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int s98c_register_device(struct s98c* ctx, char* dev_name, uint32_t clock, uint8_t panpot)
{
    if(ctx->header.version == -1) {
        fprintf(stderr, "error: Cannot define #device without #version\n");
        return 1;
    }
    {
        struct s98deviceinfo info;

        info.device = s98c_find_device(dev_name);
        if(info.device == -1) {
            fprintf(stderr, "error: Undefined device name: %s\n", dev_name);
            return 2;
        }
        info.clock = clock;
        info.panpot = panpot;
        info.reserved = 0;

        if(ctx->header.device_count >= ctx->dev_count) {
            ctx->dev_count += INITIAL_DEVICES;
            ctx->devices = realloc(ctx->devices, ctx->dev_count * sizeof(struct s98deviceinfo));
        }

        ctx->devices[ctx->header.device_count++] = info;
    }
    return 0;
}